

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O2

JsArrayKills __thiscall GlobOpt::CheckJsArrayKills(GlobOpt *this,Instr *instr)

{
  OpCode OVar1;
  uint uVar2;
  JnHelperMethod JVar3;
  StElemInfo *pSVar4;
  code *pcVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  ValueType VVar9;
  int iVar10;
  undefined4 *puVar11;
  SymOpnd *this_00;
  PropertySymOpnd *pPVar12;
  PropertySym *pPVar13;
  undefined4 extraout_var;
  Opnd *pOVar14;
  HelperCallOpnd *pHVar15;
  IndirOpnd *pIVar16;
  ProfiledInstr *pPVar17;
  uint uVar18;
  ulong uVar19;
  anon_union_1_2_471f577c_for_JsArrayKills_0 aVar20;
  anon_union_1_2_471f577c_for_JsArrayKills_0 aVar21;
  Loop *pLVar22;
  uint uVar23;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_54;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_52;
  Loop *local_50;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_48;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_46;
  uint local_44;
  char cStack_40;
  ValueType arrayValueType;
  undefined7 uStack_3f;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_36;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_34;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_32 [2];
  ValueType arrayValueType_1;
  ValueType arrayValueType_3;
  ValueType arrayValueType_2;
  
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar11 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x3564,"(instr)","instr");
    if (!bVar6) goto LAB_0042284c;
    *puVar11 = 0;
  }
  bVar6 = IR::Instr::UsesAllFields(instr);
  if (bVar6) {
    return (JsArrayKills)(anon_union_1_2_471f577c_for_JsArrayKills_0)0x1;
  }
  uVar23 = *(uint *)&this->field_0xf4 & 0x8000;
  bVar6 = DoNativeArrayTypeSpec(this);
  VVar9 = ValueType::GetObject(Array);
  bVar7 = DoArraySegmentHoist(this,VVar9);
  VVar9 = ValueType::GetObject(ObjectWithArray);
  bVar8 = DoArraySegmentHoist(this,VVar9);
  if (bVar7 != bVar8) {
    AssertCount = AssertCount + 1;
    _cStack_40 = instr;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar11 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x3572,
                       "(doArraySegmentHoist == DoArraySegmentHoist(ValueType::GetObject(ObjectType::ObjectWithArray)))"
                       ,
                       "doArraySegmentHoist == DoArraySegmentHoist(ValueType::GetObject(ObjectType::ObjectWithArray))"
                      );
    if (!bVar8) goto LAB_0042284c;
    *puVar11 = 0;
    instr = _cStack_40;
  }
  uVar2 = *(uint *)&this->field_0xf4;
  if ((bool)(~((bVar6 || bVar7) || uVar23 != 0) & (uVar2 >> 0x12 & 1) == 0)) {
    return (JsArrayKills)(anon_union_1_2_471f577c_for_JsArrayKills_0)0x0;
  }
  _cStack_40 = (Instr *)CONCAT71(uStack_3f,bVar6);
  pLVar22 = this->prePassLoop;
  OVar1 = instr->m_opcode;
  uVar19 = (ulong)(OVar1 - 0x70);
  if (OVar1 - 0x70 < 0x36) {
    if ((0x3000041UL >> (uVar19 & 0x3f) & 1) != 0) {
LAB_00422033:
      if (instr->m_dst == (Opnd *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar11 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x35bc,"(instr->GetDst())","instr->GetDst()");
        if (!bVar6) goto LAB_0042284c;
        *puVar11 = 0;
      }
      if ((~bVar7 & (uVar2 >> 0x12 & 1) == 0) != 0) {
        return (JsArrayKills)(anon_union_1_2_471f577c_for_JsArrayKills_0)0x0;
      }
      this_00 = IR::Opnd::AsSymOpnd(instr->m_dst);
      bVar6 = IR::SymOpnd::IsPropertySymOpnd(this_00);
      if (!bVar6) {
        return (JsArrayKills)(anon_union_1_2_471f577c_for_JsArrayKills_0)0x0;
      }
      pPVar12 = IR::Opnd::AsPropertySymOpnd(&this_00->super_Opnd);
      pPVar13 = Sym::AsPropertySym((pPVar12->super_SymOpnd).m_sym);
      if (pPVar13->m_propertyId != 0xd1) {
        return (JsArrayKills)(anon_union_1_2_471f577c_for_JsArrayKills_0)0x0;
      }
      if (pLVar22 == (Loop *)0x0) {
        local_52 = (pPVar12->super_SymOpnd).propertyOwnerValueType.field_0;
        bVar6 = ValueType::IsNotArray((ValueType *)&local_52.field_0);
        if (bVar6) {
          return (JsArrayKills)(anon_union_1_2_471f577c_for_JsArrayKills_0)0x0;
        }
      }
      if ((uVar2 & 0x40000) == 0) {
        return (JsArrayKills)(anon_union_1_2_471f577c_for_JsArrayKills_0)(bVar7 << 5);
      }
      return (JsArrayKills)(anon_union_1_2_471f577c_for_JsArrayKills_0)(bVar7 << 5 | 0x40);
    }
    if ((0x140000000000U >> (uVar19 & 0x3f) & 1) == 0) {
      if ((0x30000000000000U >> (uVar19 & 0x3f) & 1) != 0) {
        pOVar14 = instr->m_src1;
        if (pOVar14 != (Opnd *)0x0) {
LAB_00421fd6:
          bVar6 = IR::Opnd::IsIndirOpnd(pOVar14);
          if (!bVar6) {
            return (JsArrayKills)(anon_union_1_2_471f577c_for_JsArrayKills_0)0x0;
          }
          if (pLVar22 == (Loop *)0x0) {
            pIVar16 = IR::Opnd::AsIndirOpnd(instr->m_src1);
            local_54 = (pIVar16->m_baseOpnd->super_Opnd).m_valueType.field_0;
            bVar6 = ValueType::IsNotArrayOrObjectWithArray((ValueType *)&local_54.field_0);
            if (bVar6) {
              return (JsArrayKills)(anon_union_1_2_471f577c_for_JsArrayKills_0)0x0;
            }
          }
          aVar20.bits = (byte)(uVar23 >> 0xe);
          if (!bVar7) {
            return (JsArrayKills)aVar20;
          }
          return (JsArrayKills)(aVar20.bits + ' ');
        }
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar11 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x35a3,"(instr->GetSrc1())","instr->GetSrc1()");
        if (bVar6) {
          *puVar11 = 0;
          pOVar14 = instr->m_src1;
          goto LAB_00421fd6;
        }
        goto LAB_0042284c;
      }
      goto LAB_00421ed8;
    }
LAB_00422120:
    pOVar14 = instr->m_dst;
    if (pOVar14 == (Opnd *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar11 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x3584,"(instr->GetDst())","instr->GetDst()");
      if (!bVar6) {
LAB_0042284c:
        pcVar5 = (code *)invalidInstructionException();
        (*pcVar5)();
      }
      *puVar11 = 0;
      pOVar14 = instr->m_dst;
    }
    bVar6 = IR::Opnd::IsIndirOpnd(pOVar14);
    if (!bVar6) {
      return (JsArrayKills)(anon_union_1_2_471f577c_for_JsArrayKills_0)0x0;
    }
    if (pLVar22 == (Loop *)0x0) {
      pIVar16 = IR::Opnd::AsIndirOpnd(instr->m_dst);
      local_48 = (pIVar16->m_baseOpnd->super_Opnd).m_valueType.field_0;
      bVar6 = ValueType::IsNotArrayOrObjectWithArray((ValueType *)&local_48.field_0);
      if (bVar6) {
        return (JsArrayKills)(anon_union_1_2_471f577c_for_JsArrayKills_0)0x0;
      }
    }
    else {
      local_48.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           (anon_union_2_4_ea848c7b_for_ValueType_13)0x9;
    }
    if (instr->m_kind != InstrKindProfiled) {
      return (JsArrayKills)(anon_union_1_2_471f577c_for_JsArrayKills_0)0x0;
    }
    pPVar17 = IR::Instr::AsProfiledInstr(instr);
    pSVar4 = (pPVar17->u).stElemInfo;
    aVar20.bits = '\0';
    if ((bVar7) && (aVar20.bits = '0', ((pSVar4->field_2).bits & 0x12) == 0)) {
      aVar20.bits = '\0';
    }
    if ((uVar2 >> 0x12 & 1) != 0) {
      if ((pLVar22 == (Loop *)0x0) &&
         (bVar6 = ValueType::IsNotArray((ValueType *)&local_48.field_0), bVar6)) {
        return (JsArrayKills)aVar20;
      }
      return (JsArrayKills)
             (anon_union_1_2_471f577c_for_JsArrayKills_0)
             ((pSVar4->field_2).bits * '\x02' & 0x40 | aVar20.bits);
    }
    return (JsArrayKills)aVar20.field_0;
  }
LAB_00421ed8:
  uVar18 = OVar1 - 0x127;
  if (uVar18 < 0x31) {
    if ((0x1805UL >> ((ulong)uVar18 & 0x3f) & 1) != 0) goto LAB_00422033;
    if ((ulong)uVar18 == 0x30) {
      pOVar14 = instr->m_src1;
      if (pOVar14 == (Opnd *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar11 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x3675,"(arrayOpnd)","arrayOpnd");
        if (!bVar6) goto LAB_0042284c;
        *puVar11 = 0;
      }
      local_46 = (pOVar14->m_valueType).field_0;
      bVar6 = IR::Opnd::IsRegOpnd(pOVar14);
      if (!bVar6) {
        return (JsArrayKills)(anon_union_1_2_471f577c_for_JsArrayKills_0)0x0;
      }
      if (pLVar22 == (Loop *)0x0) {
        bVar6 = ValueType::IsNotArrayOrObjectWithArray((ValueType *)&local_46.field_0);
        if (cStack_40 != '\x01' || bVar6) {
          return (JsArrayKills)(anon_union_1_2_471f577c_for_JsArrayKills_0)0x0;
        }
        bVar6 = ValueType::IsNotNativeArray((ValueType *)&local_46.field_0);
        if (!bVar6) {
          return (JsArrayKills)(anon_union_1_2_471f577c_for_JsArrayKills_0)0x8;
        }
        return (JsArrayKills)(anon_union_1_2_471f577c_for_JsArrayKills_0)0x0;
      }
      goto LAB_00422231;
    }
  }
  if (OVar1 == NewScObjectNoCtorFull) {
LAB_00422231:
    if (cStack_40 == '\0') {
      return (JsArrayKills)(anon_union_1_2_471f577c_for_JsArrayKills_0)0x0;
    }
    return (anon_union_1_2_471f577c_for_JsArrayKills_0)
           (anon_struct_1_7_08142c7c_for_anon_union_1_2_471f577c_for_JsArrayKills_0_0)0x8;
  }
  if (OVar1 != CallDirect) {
    if (OVar1 == NewClassProto) {
      pOVar14 = instr->m_src1;
      if (pOVar14 == (Opnd *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar11 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x3684,"(instr->GetSrc1())","instr->GetSrc1()");
        if (!bVar7) goto LAB_0042284c;
        *puVar11 = 0;
        pOVar14 = instr->m_src1;
      }
      iVar10 = (*this->func->m_scriptContextInfo->_vptr_ScriptContextInfo[0x19])();
      bVar7 = IR::AddrOpnd::IsEqualAddr(pOVar14,(void *)CONCAT44(extraout_var,iVar10));
      if (bVar6 && !bVar7) {
        return (JsArrayKills)(anon_union_1_2_471f577c_for_JsArrayKills_0)0x8;
      }
      return (JsArrayKills)(anon_union_1_2_471f577c_for_JsArrayKills_0)0x0;
    }
    if (OVar1 == NewScObjectNoCtor) goto LAB_00422231;
    if (OVar1 != InlineArrayPush) {
      if (OVar1 != InlineArrayPop) {
        if (OVar1 != StElemC) {
          return (JsArrayKills)(anon_union_1_2_471f577c_for_JsArrayKills_0)0x0;
        }
        goto LAB_00422120;
      }
      pOVar14 = instr->m_src1;
      if (pOVar14 == (Opnd *)0x0) {
        AssertCount = AssertCount + 1;
        local_50 = pLVar22;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar11 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x360f,"(arrayOpnd)","arrayOpnd");
        if (!bVar6) goto LAB_0042284c;
        *puVar11 = 0;
        pLVar22 = local_50;
      }
      local_36 = (pOVar14->m_valueType).field_0;
      bVar6 = IR::Opnd::IsRegOpnd(pOVar14);
      if (!bVar6) {
        return (JsArrayKills)(anon_union_1_2_471f577c_for_JsArrayKills_0)0x0;
      }
      if (pLVar22 == (Loop *)0x0) {
        bVar6 = ValueType::IsNotArrayOrObjectWithArray((ValueType *)&local_36.field_0);
        if (bVar6) {
          return (JsArrayKills)(anon_union_1_2_471f577c_for_JsArrayKills_0)0x0;
        }
        aVar20.bits = bVar7 << 5;
        if ((uVar2 >> 0x12 & 1) == 0) goto LAB_00422783;
        bVar6 = ValueType::IsNotArray((ValueType *)&local_36.field_0);
        if (!bVar6) goto LAB_004222d7;
        if (uVar23 == 0) {
          return (JsArrayKills)aVar20.field_0;
        }
      }
      else {
        aVar20.bits = bVar7 << 5;
        if ((uVar2 >> 0x12 & 1) == 0) {
          if (uVar23 == 0) {
            return (JsArrayKills)aVar20;
          }
          goto LAB_0042279a;
        }
LAB_004222d7:
        aVar20.bits = bVar7 << 5 | 0x40;
LAB_00422783:
        if (uVar23 == 0) {
          return (JsArrayKills)aVar20.field_0;
        }
        if (pLVar22 != (Loop *)0x0) goto LAB_0042279a;
      }
      bVar6 = ValueType::IsArray((ValueType *)&local_36.field_0);
      if (bVar6) {
        return (JsArrayKills)aVar20.field_0;
      }
LAB_0042279a:
      return (JsArrayKills)(anon_union_1_2_471f577c_for_JsArrayKills_0)(aVar20.bits | 4);
    }
    local_50 = pLVar22;
    if (instr->m_src2 == (Opnd *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar11 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x35e3,"(instr->GetSrc2())","instr->GetSrc2()");
      if (!bVar6) goto LAB_0042284c;
      *puVar11 = 0;
    }
    pOVar14 = instr->m_src1;
    local_44 = uVar2;
    if (pOVar14 == (Opnd *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar11 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x35e5,"(arrayOpnd)","arrayOpnd");
      if (!bVar6) goto LAB_0042284c;
      *puVar11 = 0;
    }
    local_32[0] = (pOVar14->m_valueType).field_0;
    bVar6 = IR::Opnd::IsRegOpnd(pOVar14);
    if (!bVar6) {
      return (JsArrayKills)(anon_union_1_2_471f577c_for_JsArrayKills_0)0x0;
    }
    if (local_50 == (Loop *)0x0) {
      bVar6 = ValueType::IsNotArrayOrObjectWithArray((ValueType *)&local_32[0].field_0);
      if (bVar6) {
        return (JsArrayKills)(anon_union_1_2_471f577c_for_JsArrayKills_0)0x0;
      }
      aVar20.bits = (byte)(uVar23 >> 0xe);
      aVar21.bits = aVar20.bits + '0';
      if (!bVar7) {
        aVar21.bits = aVar20.bits;
      }
      if ((local_44 >> 0x12 & 1) == 0) goto LAB_004227db;
      bVar6 = ValueType::IsNotArray((ValueType *)&local_32[0].field_0);
      if (!bVar6) goto LAB_004223e4;
      if (cStack_40 == '\0') {
        return (JsArrayKills)aVar21.field_0;
      }
    }
    else {
      aVar20.bits = (byte)(uVar23 >> 0xe);
      aVar21.bits = aVar20.bits + '0';
      if (!bVar7) {
        aVar21.bits = aVar20.bits;
      }
      if ((local_44 >> 0x12 & 1) == 0) {
        if (cStack_40 == '\0') {
          return (JsArrayKills)aVar21.field_0;
        }
        goto LAB_00422843;
      }
LAB_004223e4:
      aVar21.bits = aVar21.bits | 0x40;
LAB_004227db:
      if (cStack_40 == '\0') {
        return (JsArrayKills)aVar21.field_0;
      }
      if (local_50 != (Loop *)0x0) goto LAB_00422843;
    }
    bVar6 = ValueType::IsNativeArray((ValueType *)&local_32[0].field_0);
    if (bVar6) {
      bVar6 = ValueType::IsLikelyNativeIntArray((ValueType *)&local_32[0].field_0);
      if ((bVar6) && (instr->m_src2->m_type == TyInt32)) {
        return (JsArrayKills)aVar21.field_0;
      }
      bVar6 = ValueType::IsLikelyNativeFloatArray((ValueType *)&local_32[0].field_0);
      if ((bVar6) && ((byte)(instr->m_src2->m_type - TyFloat32) < 2)) {
        return (JsArrayKills)aVar21.field_0;
      }
    }
    bVar6 = ValueType::IsNotNativeArray((ValueType *)&local_32[0].field_0);
    if (bVar6) {
      return (JsArrayKills)aVar21.field_0;
    }
    goto LAB_00422843;
  }
  local_50 = pLVar22;
  local_44 = uVar2;
  if (instr->m_src1 == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar11 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x362a,"(instr->GetSrc1())","instr->GetSrc1()");
    if (!bVar6) goto LAB_0042284c;
    *puVar11 = 0;
  }
  pOVar14 = IR::Instr::FindCallArgumentOpnd(instr,1,(Instr **)0x0);
  if (pOVar14 == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar11 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x362e,"(arrayOpnd)","arrayOpnd");
    if (!bVar6) goto LAB_0042284c;
    *puVar11 = 0;
  }
  local_34 = (pOVar14->m_valueType).field_0;
  bVar6 = IR::Opnd::IsRegOpnd(pOVar14);
  if (!bVar6) {
    return (JsArrayKills)(anon_union_1_2_471f577c_for_JsArrayKills_0)0x0;
  }
  if ((local_50 == (Loop *)0x0) &&
     (bVar6 = ValueType::IsNotArrayOrObjectWithArray((ValueType *)&local_34.field_0), bVar6)) {
    return (JsArrayKills)(anon_union_1_2_471f577c_for_JsArrayKills_0)0x0;
  }
  pHVar15 = IR::Opnd::AsHelperCallOpnd(instr->m_src1);
  JVar3 = pHVar15->m_fnHelper;
  if (uVar23 == 0) {
    aVar21.bits = '\0';
  }
  else if (JVar3 - HelperArray_Reverse < 5) {
    aVar21.bits = (byte)(0x202000202 >> ((char)(JVar3 - HelperArray_Reverse) * '\b' & 0x3fU));
  }
  else {
    aVar21.bits = '\0';
  }
  if (((bVar7) && (JVar3 - HelperArray_Concat < 0x11)) &&
     ((0x1b001U >> (JVar3 - HelperArray_Concat & 0x1f) & 1) != 0)) {
    aVar21.bits = aVar21.bits | 0x30;
  }
  if ((local_44 >> 0x12 & 1) == 0) {
LAB_0042271a:
    if (cStack_40 == '\0') {
      return (JsArrayKills)aVar21.field_0;
    }
    if (local_50 == (Loop *)0x0) goto LAB_0042272b;
  }
  else {
    if ((local_50 != (Loop *)0x0) ||
       (bVar6 = ValueType::IsNotArray((ValueType *)&local_34.field_0), !bVar6)) {
      if ((JVar3 - HelperArray_Shift < 4) && (JVar3 - HelperArray_Shift != 1)) {
        aVar21.bits = aVar21.bits | 0x40;
      }
      goto LAB_0042271a;
    }
    if (cStack_40 == '\0') {
      return (JsArrayKills)aVar21.field_0;
    }
LAB_0042272b:
    bVar6 = ValueType::IsNotNativeArray((ValueType *)&local_34.field_0);
    if (bVar6) {
      return (JsArrayKills)aVar21.field_0;
    }
  }
  if (0x10 < JVar3 - HelperArray_Concat) {
    return (JsArrayKills)aVar21.field_0;
  }
  if ((0x1f001U >> (JVar3 - HelperArray_Concat & 0x1f) & 1) == 0) {
    return (JsArrayKills)aVar21;
  }
LAB_00422843:
  return (JsArrayKills)(anon_union_1_2_471f577c_for_JsArrayKills_0)(aVar21.bits | 8);
}

Assistant:

JsArrayKills
GlobOpt::CheckJsArrayKills(IR::Instr *const instr)
{
    Assert(instr);

    JsArrayKills kills;
    if(instr->UsesAllFields())
    {
        // Calls can (but are unlikely to) change a javascript array into an ES5 array, which may have different behavior for
        // index properties.
        kills.SetKillsAllArrays();
        return kills;
    }

    const bool doArrayMissingValueCheckHoist = DoArrayMissingValueCheckHoist();
    const bool doNativeArrayTypeSpec = DoNativeArrayTypeSpec();
    const bool doArraySegmentHoist = DoArraySegmentHoist(ValueType::GetObject(ObjectType::Array));
    Assert(doArraySegmentHoist == DoArraySegmentHoist(ValueType::GetObject(ObjectType::ObjectWithArray)));
    const bool doArrayLengthHoist = DoArrayLengthHoist();
    if(!doArrayMissingValueCheckHoist && !doNativeArrayTypeSpec && !doArraySegmentHoist && !doArrayLengthHoist)
    {
        return kills;
    }

    // The following operations may create missing values in an array in an unlikely circumstance. Even though they don't kill
    // the fact that the 'this' parameter is an array (when implicit calls are disabled), we don't have a way to say the value
    // type is definitely array but it likely has no missing values. So, these will kill the definite value type as well, making
    // it likely array, such that the array checks will have to be redone.
    const bool useValueTypes = !IsLoopPrePass(); // Source value types are not guaranteed to be correct in a loop prepass
    switch(instr->m_opcode)
    {
        case Js::OpCode::StElemC:
        case Js::OpCode::StElemI_A:
        case Js::OpCode::StElemI_A_Strict:
        {
            Assert(instr->GetDst());
            if(!instr->GetDst()->IsIndirOpnd())
            {
                break;
            }
            const ValueType baseValueType =
                useValueTypes ? instr->GetDst()->AsIndirOpnd()->GetBaseOpnd()->GetValueType() : ValueType::Uninitialized;
            if(useValueTypes && baseValueType.IsNotArrayOrObjectWithArray())
            {
                break;
            }
            if(instr->IsProfiledInstr())
            {
                const Js::StElemInfo *const stElemInfo = instr->AsProfiledInstr()->u.stElemInfo;
                if(doArraySegmentHoist && stElemInfo->LikelyStoresOutsideHeadSegmentBounds())
                {
                    kills.SetKillsArrayHeadSegments();
                    kills.SetKillsArrayHeadSegmentLengths();
                }
                if(doArrayLengthHoist &&
                    !(useValueTypes && baseValueType.IsNotArray()) &&
                    stElemInfo->LikelyStoresOutsideArrayBounds())
                {
                    kills.SetKillsArrayLengths();
                }
            }
            break;
        }

        case Js::OpCode::DeleteElemI_A:
        case Js::OpCode::DeleteElemIStrict_A:
            Assert(instr->GetSrc1());
            if(!instr->GetSrc1()->IsIndirOpnd() ||
                (useValueTypes && instr->GetSrc1()->AsIndirOpnd()->GetBaseOpnd()->GetValueType().IsNotArrayOrObjectWithArray()))
            {
                break;
            }
            if(doArrayMissingValueCheckHoist)
            {
                kills.SetKillsArraysWithNoMissingValues();
            }
            if(doArraySegmentHoist)
            {
                kills.SetKillsArrayHeadSegmentLengths();
            }
            break;

        case Js::OpCode::ConsoleScopedStFld:
        case Js::OpCode::ConsoleScopedStFldStrict:
        case Js::OpCode::ScopedStFld:
        case Js::OpCode::ScopedStFldStrict:
        case Js::OpCode::StFld:
        case Js::OpCode::StFldStrict:
        case Js::OpCode::StSuperFld:
        case Js::OpCode::StSuperFldStrict:
        {
            Assert(instr->GetDst());

            if(!doArraySegmentHoist && !doArrayLengthHoist)
            {
                break;
            }

            IR::SymOpnd *const symDst = instr->GetDst()->AsSymOpnd();
            if(!symDst->IsPropertySymOpnd())
            {
                break;
            }

            IR::PropertySymOpnd *const dst = symDst->AsPropertySymOpnd();
            if(dst->m_sym->AsPropertySym()->m_propertyId != Js::PropertyIds::length)
            {
                break;
            }

            if(useValueTypes && dst->GetPropertyOwnerValueType().IsNotArray())
            {
                // Setting the 'length' property of an object that is not an array, even if it has an internal array, does
                // not kill the head segment or head segment length of any arrays.
                break;
            }

            if(doArraySegmentHoist)
            {
                kills.SetKillsArrayHeadSegmentLengths();
            }
            if(doArrayLengthHoist)
            {
                kills.SetKillsArrayLengths();
            }
            break;
        }

        case Js::OpCode::InlineArrayPush:
        {
            Assert(instr->GetSrc2());
            IR::Opnd *const arrayOpnd = instr->GetSrc1();
            Assert(arrayOpnd);

            const ValueType arrayValueType(arrayOpnd->GetValueType());

            if(!arrayOpnd->IsRegOpnd() || (useValueTypes && arrayValueType.IsNotArrayOrObjectWithArray()))
            {
                break;
            }

            if(doArrayMissingValueCheckHoist)
            {
                kills.SetKillsArraysWithNoMissingValues();
            }

            if(doArraySegmentHoist)
            {
                kills.SetKillsArrayHeadSegments();
                kills.SetKillsArrayHeadSegmentLengths();
            }

            if(doArrayLengthHoist && !(useValueTypes && arrayValueType.IsNotArray()))
            {
                kills.SetKillsArrayLengths();
            }

            // Don't kill NativeArray, if there is no mismatch between array's type and element's type.
            if(doNativeArrayTypeSpec &&
               !(useValueTypes && arrayValueType.IsNativeArray() &&
                    ((arrayValueType.IsLikelyNativeIntArray() && instr->GetSrc2()->IsInt32()) ||
                     (arrayValueType.IsLikelyNativeFloatArray() && instr->GetSrc2()->IsFloat()))
                ) &&
               !(useValueTypes && arrayValueType.IsNotNativeArray()))
            {
                kills.SetKillsNativeArrays();
            }

            break;
        }

        case Js::OpCode::InlineArrayPop:
        {
            IR::Opnd *const arrayOpnd = instr->GetSrc1();
            Assert(arrayOpnd);

            const ValueType arrayValueType(arrayOpnd->GetValueType());
            if(!arrayOpnd->IsRegOpnd() || (useValueTypes && arrayValueType.IsNotArrayOrObjectWithArray()))
            {
                break;
            }

            if(doArraySegmentHoist)
            {
                kills.SetKillsArrayHeadSegmentLengths();
            }

            if(doArrayLengthHoist && !(useValueTypes && arrayValueType.IsNotArray()))
            {
                kills.SetKillsArrayLengths();
            }

            if(doArrayMissingValueCheckHoist && !(useValueTypes && arrayValueType.IsArray()))
            {
                kills.SetKillsObjectArraysWithNoMissingValues();
            }
            break;
        }

        case Js::OpCode::CallDirect:
        {
            Assert(instr->GetSrc1());

            // Find the 'this' parameter and check if it's possible for it to be an array
            IR::Opnd *const arrayOpnd = instr->FindCallArgumentOpnd(1);
            Assert(arrayOpnd);
            const ValueType arrayValueType(arrayOpnd->GetValueType());
            if(!arrayOpnd->IsRegOpnd() || (useValueTypes && arrayValueType.IsNotArrayOrObjectWithArray()))
            {
                break;
            }

            const IR::JnHelperMethod helperMethod = instr->GetSrc1()->AsHelperCallOpnd()->m_fnHelper;
            if(doArrayMissingValueCheckHoist)
            {
                switch(helperMethod)
                {
                    case IR::HelperArray_Reverse:
                    case IR::HelperArray_Shift:
                    case IR::HelperArray_Splice:
                    case IR::HelperArray_Unshift:
                        kills.SetKillsArraysWithNoMissingValues();
                        break;
                }
            }

            if(doArraySegmentHoist)
            {
                switch(helperMethod)
                {
                    case IR::HelperArray_Reverse:
                    case IR::HelperArray_Shift:
                    case IR::HelperArray_Splice:
                    case IR::HelperArray_Unshift:
                    case IR::HelperArray_Concat:
                        kills.SetKillsArrayHeadSegments();
                        kills.SetKillsArrayHeadSegmentLengths();
                        break;
                }
            }

            if(doArrayLengthHoist && !(useValueTypes && arrayValueType.IsNotArray()))
            {
                switch(helperMethod)
                {
                    case IR::HelperArray_Shift:
                    case IR::HelperArray_Splice:
                    case IR::HelperArray_Unshift:
                        kills.SetKillsArrayLengths();
                        break;
                }
            }

            if(doNativeArrayTypeSpec && !(useValueTypes && arrayValueType.IsNotNativeArray()))
            {
                switch(helperMethod)
                {
                    case IR::HelperArray_Reverse:
                    case IR::HelperArray_Shift:
                    case IR::HelperArray_Slice:
                    // Currently not inlined.
                    //case IR::HelperArray_Sort:
                    case IR::HelperArray_Splice:
                    case IR::HelperArray_Unshift:
                    case IR::HelperArray_Concat:
                        kills.SetKillsNativeArrays();
                        break;
                }
            }
            break;
        }

        case Js::OpCode::InitProto:
        {
            // Find the 'this' parameter and check if it's possible for it to be an array
            IR::Opnd *const arrayOpnd = instr->GetSrc1();
            Assert(arrayOpnd);
            const ValueType arrayValueType(arrayOpnd->GetValueType());
            if(!arrayOpnd->IsRegOpnd() || (useValueTypes && arrayValueType.IsNotArrayOrObjectWithArray()))
            {
                break;
            }

            if(doNativeArrayTypeSpec && !(useValueTypes && arrayValueType.IsNotNativeArray()))
            {
                kills.SetKillsNativeArrays();
            }
            break;
        }            

        case Js::OpCode::NewClassProto:
            Assert(instr->GetSrc1());
            if (IR::AddrOpnd::IsEqualAddr(instr->GetSrc1(), (void*)func->GetScriptContextInfo()->GetObjectPrototypeAddr()))
            {
                // No extends operand, the proto parent is the Object prototype
                break;
            }
            // Fall through
        case Js::OpCode::NewScObjectNoCtor:
        case Js::OpCode::NewScObjectNoCtorFull:
            if(doNativeArrayTypeSpec)
            {
                // Class/object construction can make something a prototype
                kills.SetKillsNativeArrays();
            }
            break;
    }

    return kills;
}